

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_7f21c::ParseCommandActions::actOnBindingDecl
          (ParseCommandActions *this,Token *name,Token *value)

{
  ostream *poVar1;
  size_t in_RCX;
  StringRef str;
  StringRef str_00;
  string local_58;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"actOnBindingDecl",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(/*Name=*/",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
  str.Data = (char *)(ulong)name->length;
  str.Length = in_RCX;
  llbuild::commands::util::escapedString_abi_cxx11_(&local_38,(util *)name->start,str);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/*Value=*/\"",0xb);
  str_00.Data = (char *)(ulong)value->length;
  str_00.Length = in_RCX;
  llbuild::commands::util::escapedString_abi_cxx11_(&local_58,(util *)value->start,str_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void actOnBindingDecl(const ninja::Token& name,
                                const ninja::Token& value) override {
    std::cerr << __FUNCTION__ << "(/*Name=*/"
              << "\"" << escapedString(name) << "\", "
              << "/*Value=*/\"" << escapedString(value) << "\")\n";
  }